

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.h
# Opt level: O3

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
rest_rpc::rpc_service::msgpack_codec::unpack<std::tuple<std::__cxx11::string,std::__cxx11::string>>
          (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,msgpack_codec *this,char *data,size_t length)

{
  bool referenced;
  size_t local_50;
  undefined1 local_48 [24];
  size_t local_30;
  size_t local_28;
  size_t local_20;
  
  local_48._0_8_ = 0xffffffff;
  local_48._8_8_ = 0xffffffff;
  local_48._16_8_ = (object *)0xffffffff;
  local_30 = 0xffffffff;
  local_28 = 0xffffffff;
  local_20 = 0xffffffff;
  local_50 = 0;
  msgpack::v3::unpack(&this->msg_,data,length,&local_50,&referenced,(unpack_reference_func)0x0,
                      (void *)0x0,(unpack_limit *)local_48);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).
                 super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl.field_2;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_string_length = 0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl.field_2;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_string_length = 0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl.field_2._M_local_buf[0] = '\0';
  local_48._16_8_ = (this->msg_).m_obj.super_object.via.array.ptr;
  local_48._0_8_ = *(undefined8 *)&(this->msg_).m_obj.super_object;
  local_48._8_8_ = (this->msg_).m_obj.super_object.via.u64;
  msgpack::v1::adaptor::
  convert<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::operator()((convert<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                *)&local_50,(object *)local_48,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

T unpack(char const *data, size_t length) {
    try {
      msgpack::unpack(msg_, data, length);
      return msg_.get().as<T>();
    } catch (...) {
      throw std::invalid_argument("unpack failed: Args not match!");
    }
  }